

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int isJolietSVD(iso9660 *iso9660,uchar *h)

{
  uint16_t uVar1;
  int iVar2;
  uint32_t uVar3;
  char local_38;
  int level;
  int32_t volume_block;
  ssize_t logical_block_size;
  uchar *p;
  uchar *h_local;
  iso9660 *iso9660_local;
  
  iVar2 = isSVD(iso9660,h);
  if (iVar2 == 0) {
    iso9660_local._4_4_ = 0;
  }
  else if ((h[0x58] == '%') && (h[0x59] == '/')) {
    if (h[0x5a] == '@') {
      local_38 = '\x01';
    }
    else if (h[0x5a] == 'C') {
      local_38 = '\x02';
    }
    else {
      if (h[0x5a] != 'E') {
        return 0;
      }
      local_38 = '\x03';
    }
    iso9660->seenJoliet = local_38;
    uVar1 = archive_le16dec(h + 0x80);
    uVar3 = archive_le32dec(h + 0x50);
    iso9660->logical_block_size = (ulong)uVar1;
    iso9660->volume_block = uVar3;
    iso9660->volume_size = (ulong)uVar1 * (long)(int)uVar3;
    uVar3 = archive_le32dec(h + 0x9e);
    (iso9660->joliet).location = uVar3;
    uVar3 = archive_le32dec(h + 0xa6);
    (iso9660->joliet).size = uVar3;
    iso9660_local._4_4_ = 0x30;
  }
  else {
    iso9660_local._4_4_ = 0;
  }
  return iso9660_local._4_4_;
}

Assistant:

static int
isJolietSVD(struct iso9660 *iso9660, const unsigned char *h)
{
	const unsigned char *p;
	ssize_t logical_block_size;
	int32_t volume_block;

	/* Check if current sector is a kind of Supplementary Volume
	 * Descriptor. */
	if (!isSVD(iso9660, h))
		return (0);

	/* FIXME: do more validations according to joliet spec. */

	/* check if this SVD contains joliet extension! */
	p = h + SVD_escape_sequences_offset;
	/* N.B. Joliet spec says p[1] == '\\', but.... */
	if (p[0] == '%' && p[1] == '/') {
		int level = 0;

		if (p[2] == '@')
			level = 1;
		else if (p[2] == 'C')
			level = 2;
		else if (p[2] == 'E')
			level = 3;
		else /* not joliet */
			return (0);

		iso9660->seenJoliet = level;

	} else /* not joliet */
		return (0);

	logical_block_size =
	    archive_le16dec(h + SVD_logical_block_size_offset);
	volume_block = archive_le32dec(h + SVD_volume_space_size_offset);

	iso9660->logical_block_size = logical_block_size;
	iso9660->volume_block = volume_block;
	iso9660->volume_size = logical_block_size * (uint64_t)volume_block;
	/* Read Root Directory Record in Volume Descriptor. */
	p = h + SVD_root_directory_record_offset;
	iso9660->joliet.location = archive_le32dec(p + DR_extent_offset);
	iso9660->joliet.size = archive_le32dec(p + DR_size_offset);

	return (48);
}